

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

uint __thiscall
crnlib::dxt_image::get_block_colors
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *pColors,
          uint subblock_index)

{
  char cVar1;
  byte bVar2;
  uint16 uVar3;
  uint16 packed_delta3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint table_idx;
  uint table_idx_00;
  uchar *puVar7;
  dxt5_block *block5;
  etc1_block *this_00;
  uint values [8];
  
  uVar4 = 0;
  if (this->m_element_type[element_index] - cColorDXT1 < 4) {
    this_00 = (etc1_block *)
              (this->m_pElements +
              ((block_y * this->m_blocks_x + block_x) * this->m_num_elements_per_block +
              element_index));
    switch(this->m_element_type[element_index]) {
    case cColorDXT1:
      uVar4 = dxt1_block::get_block_colors
                        (pColors,*(uint16 *)&this_00->field_0,
                         *(uint16 *)((long)&this_00->field_0 + 2));
      return uVar4;
    case cAlphaDXT3:
      puVar7 = (pColors->field_0).c + (uint)(int)this->m_element_component_index[element_index];
      uVar4 = 0x10;
      for (lVar5 = 0; lVar5 != 0x110; lVar5 = lVar5 + 0x11) {
        *puVar7 = (uchar)lVar5;
        puVar7 = puVar7 + 4;
      }
      break;
    case cAlphaDXT5:
      uVar4 = dxt5_block::get_block_values
                        (values,(uint)(this_00->field_0).m_bytes[0],
                         (uint)(this_00->field_0).m_bytes[1]);
      cVar1 = this->m_element_component_index[element_index];
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        pColors[uVar6].field_0.c[(uint)(int)cVar1] = (uchar)values[uVar6];
      }
      break;
    case cColorETC1:
      bVar2 = (this_00->field_0).m_bytes[3];
      table_idx = (uint)(bVar2 >> 5);
      table_idx_00 = bVar2 >> 2 & 7;
      if ((bVar2 & 2) == 0) {
        if (subblock_index == 0) {
          uVar3 = etc1_block::get_base4_color(this_00,0);
        }
        else {
          uVar3 = etc1_block::get_base4_color(this_00,1);
          table_idx = table_idx_00;
        }
        etc1_block::get_abs_subblock_colors(pColors,uVar3,table_idx);
        uVar4 = 0;
      }
      else {
        uVar3 = etc1_block::get_base5_color(this_00);
        packed_delta3 = etc1_block::get_delta3_color(this_00);
        if (subblock_index == 0) {
          etc1_block::get_diff_subblock_colors(pColors,uVar3,table_idx);
          uVar4 = 0;
        }
        else {
          etc1_block::get_diff_subblock_colors(pColors,uVar3,packed_delta3,table_idx_00);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

uint dxt_image::get_block_colors(uint block_x, uint block_y, uint element_index, color_quad_u8* pColors, uint subblock_index)
    {
        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
            const uint table_index0 = src_block.get_inten_table(0);
            const uint table_index1 = src_block.get_inten_table(1);
            if (src_block.get_diff_bit())
            {
                const uint16 base_color5 = src_block.get_base5_color();
                const uint16 delta_color3 = src_block.get_delta3_color();
                if (subblock_index)
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, delta_color3, table_index1);
                }
                else
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, table_index0);
                }
            }
            else
            {
                if (subblock_index)
                {
                    const uint16 base_color4_1 = src_block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_1, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = src_block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_0, table_index0);
                }
            }

            break;
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
            return dxt1_block::get_block_colors(pColors, static_cast<uint16>(block1.get_low_color()), static_cast<uint16>(block1.get_high_color()));
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);

            uint values[cDXT5SelectorValues];

            const uint n = dxt5_block::get_block_values(values, block5.get_low_alpha(), block5.get_high_alpha());

            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < n; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>(values[i]);
            }

            return n;
        }
        case cAlphaDXT3:
        {
            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < 16; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>((i << 4) | i);
            }

            return 16;
        }
        default:
            break;
        }

        return 0;
    }